

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeDPRRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus DVar4;
  MCInst *in_RCX;
  uint32_t in_ESI;
  uint regs;
  uint Vd;
  uint i;
  DecodeStatus S;
  uint32_t local_44;
  uint in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  uint local_30;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,8,5);
  uVar3 = fieldFromInstruction_4(in_ESI,1,7);
  if (((uVar3 == 0) || (0x10 < uVar3)) || (local_44 = uVar3, 0x20 < uVar2 + uVar3)) {
    if (0x20 < uVar2 + uVar3) {
      uVar3 = 0x20 - uVar2;
    }
    in_stack_ffffffffffffffc0 = uVar3;
    if (uVar3 == 0) {
      in_stack_ffffffffffffffc0 = 1;
    }
    local_44 = in_stack_ffffffffffffffc0;
    if (0xf < in_stack_ffffffffffffffc0) {
      local_44 = 0x10;
    }
    local_4 = MCDisassembler_SoftFail;
    in_stack_ffffffffffffffc4 = uVar3;
  }
  DVar4 = DecodeDPRRegisterClass
                    (in_RCX,local_4,CONCAT44(uVar2,local_44),
                     (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
  if (_Var1) {
    for (local_30 = 0; local_30 < local_44 - 1; local_30 = local_30 + 1) {
      uVar2 = uVar2 + 1;
      DVar4 = DecodeDPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar2,local_44),
                         (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeDPRRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned i;
	unsigned Vd = fieldFromInstruction_4(Val, 8, 5);
	unsigned regs = fieldFromInstruction_4(Val, 1, 7);

	// In case of unpredictable encoding, tweak the operands.
	if (regs == 0 || regs > 16 || (Vd + regs) > 32) {
		regs = Vd + regs > 32 ? 32 - Vd : regs;
		regs = (1u > regs? 1u : regs);
		regs = (16u > regs? regs : 16u);
		S = MCDisassembler_SoftFail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;

	for (i = 0; i < (regs - 1); ++i) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, ++Vd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}